

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::load_flattened_struct(CompilerGLSL *this,string *basename,SPIRType *type)

{
  uint uVar1;
  uint32_t id;
  size_t sVar2;
  TypedID *this_00;
  size_t in_RCX;
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  undefined1 local_68 [40];
  SPIRType *member_type;
  uint32_t i;
  char local_29;
  size_t local_28;
  SPIRType *type_local;
  string *basename_local;
  CompilerGLSL *this_local;
  string *expr;
  
  local_29 = '\0';
  local_28 = in_RCX;
  type_local = type;
  basename_local = basename;
  this_local = this;
  type_to_glsl_constructor_abi_cxx11_(this,(SPIRType *)basename);
  ::std::__cxx11::string::operator+=((string *)this,'(');
  for (member_type._0_4_ = 0; uVar1 = (uint)member_type,
      sVar2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                        ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                         (local_28 + 0x88)), uVar1 < (uint)sVar2;
      member_type._0_4_ = (uint)member_type + 1) {
    if ((uint)member_type != 0) {
      ::std::__cxx11::string::operator+=((string *)this,", ");
    }
    this_00 = (TypedID *)
              VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                        ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                         (local_28 + 0x88),(ulong)(uint)member_type);
    id = TypedID::operator_cast_to_unsigned_int(this_00);
    local_68._32_8_ = Compiler::get<spirv_cross::SPIRType>((Compiler *)basename,id);
    if (*(int *)&(((SPIRType *)local_68._32_8_)->super_IVariant).field_0xc == 0xf) {
      to_flattened_struct_member((CompilerGLSL *)local_88,basename,type_local,(uint32_t)local_28);
      load_flattened_struct((CompilerGLSL *)local_68,basename,(SPIRType *)local_88);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_68);
      ::std::__cxx11::string::~string((string *)local_68);
      ::std::__cxx11::string::~string((string *)local_88);
    }
    else {
      to_flattened_struct_member((CompilerGLSL *)local_a8,basename,type_local,(uint32_t)local_28);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_a8);
      ::std::__cxx11::string::~string((string *)local_a8);
    }
  }
  ::std::__cxx11::string::operator+=((string *)this,')');
  return this;
}

Assistant:

string CompilerGLSL::load_flattened_struct(const string &basename, const SPIRType &type)
{
	auto expr = type_to_glsl_constructor(type);
	expr += '(';

	for (uint32_t i = 0; i < uint32_t(type.member_types.size()); i++)
	{
		if (i)
			expr += ", ";

		auto &member_type = get<SPIRType>(type.member_types[i]);
		if (member_type.basetype == SPIRType::Struct)
			expr += load_flattened_struct(to_flattened_struct_member(basename, type, i), member_type);
		else
			expr += to_flattened_struct_member(basename, type, i);
	}
	expr += ')';
	return expr;
}